

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int do_list_devices(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  long in_FS_OFFSET;
  uint local_174;
  uint local_170;
  uint retries;
  uint ndevices;
  uint uStack_164;
  _Bool do_info;
  int ret;
  igsc_device_handle handle;
  igsc_device_iterator *iter;
  char **argv_local;
  int argc_local;
  igsc_fw_version fw_version;
  igsc_oprom_version oprom_version;
  igsc_device_info info;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  local_170 = 0;
  iter = (igsc_device_iterator *)argv;
  argv_local._4_4_ = argc;
  memset(&ret,0,8);
  memset(&stack0xfffffffffffffec2,0,8);
  memset(&fw_version,0,8);
  if (0 < argv_local._4_4_) {
    _Var3 = arg_is_info(*(char **)iter);
    if (!_Var3) {
      if ((quiet & 1U) == 0) {
        fprintf(_stderr,"Error: Wrong argument: %s\n",*(undefined8 *)iter);
      }
      uStack_164 = 0xffffffff;
      goto LAB_0010583f;
    }
    bVar2 = true;
  }
  _Var3 = arg_next((int *)((long)&argv_local + 4),(char ***)&iter);
  if (_Var3) {
    if (((verbose & 1U) != 0) && ((quiet & 1U) == 0)) {
      fprintf(_stderr,"Too many arguments\n");
    }
    uStack_164 = 0xffffffff;
  }
  else {
    uVar4 = igsc_device_iterator_create(&handle);
    if (uVar4 == 0) {
      oprom_version.version[0] = '\0';
      while (ndevices = igsc_device_iterator_next(handle.ctx,&oprom_version), ndevices == 0) {
        iVar5 = igsc_device_init_by_device_info(&ret,&oprom_version);
        if (iVar5 == 0) {
          igsc_device_update_device_info(&ret,&oprom_version);
          local_170 = local_170 + 1;
          printf("Device [%d] \'%s\': %04hx:%04hx %04hx:%04hx %04hu:%02x:%02x.%02x\n",
                 (ulong)local_170,&oprom_version,(ulong)info.domain,(ulong)(ushort)info.name._254_2_
                 ,(ulong)(ushort)info._260_2_,(uint)(ushort)info._258_2_,
                 (uint)(ushort)info.name._248_2_,(uint)(byte)info.name[0xfa],
                 (uint)(byte)info.name[0xfb],(uint)(byte)info.name[0xfc]);
          if (bVar2) {
            local_174 = 0;
            do {
              iVar5 = igsc_device_fw_version(&ret,&stack0xfffffffffffffec2);
              if (iVar5 != 0xd) break;
              gsc_msleep(2000);
              local_174 = local_174 + 1;
            } while (local_174 < 3);
            if (iVar5 == 0) {
              print_fw_version("",(igsc_fw_version *)&stack0xfffffffffffffec2);
            }
            local_174 = 0;
            do {
              iVar5 = igsc_device_oprom_version(&ret,2,&fw_version);
              if (iVar5 != 0xd) break;
              gsc_msleep(2000);
              local_174 = local_174 + 1;
            } while (local_174 < 3);
            if (iVar5 == 0) {
              print_oprom_code_version((igsc_oprom_version *)&fw_version);
            }
            local_174 = 0;
            do {
              iVar5 = igsc_device_oprom_version(&ret,1,&fw_version);
              if (iVar5 != 0xd) break;
              gsc_msleep(2000);
              local_174 = local_174 + 1;
            } while (local_174 < 3);
            if (iVar5 == 0) {
              print_oprom_data_version((igsc_oprom_version *)&fw_version);
            }
          }
          oprom_version.version[0] = '\0';
          igsc_device_close(&ret);
        }
        else {
          oprom_version.version[0] = '\0';
        }
      }
      if (ndevices == 4) {
        ndevices = 0;
      }
      else if ((quiet & 1U) == 0) {
        fprintf(_stderr,"Error: Failure in the device iterator: %d\n",(ulong)ndevices);
      }
      igsc_device_iterator_destroy(handle.ctx);
      if ((local_170 == 0) && ((quiet & 1U) == 0)) {
        fprintf(_stdout,"No device found\n");
      }
      uStack_164 = ndevices;
    }
    else {
      if ((quiet & 1U) == 0) {
        fprintf(_stderr,"Error: Cannot create device iterator %d\n",(ulong)uVar4);
      }
      uStack_164 = 1;
    }
  }
LAB_0010583f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uStack_164;
}

Assistant:

static int do_list_devices(int argc, char *argv[])
{
    struct igsc_device_iterator *iter;
    struct igsc_device_info info;
    int ret;
    struct igsc_device_handle handle;
    struct igsc_fw_version fw_version;
    struct igsc_oprom_version oprom_version;
    bool do_info = false;
    unsigned int ndevices = 0;
    unsigned int retries;

    memset(&handle, 0, sizeof(handle));
    memset(&fw_version, 0, sizeof(fw_version));
    memset(&oprom_version, 0, sizeof(oprom_version));

    if (argc >= 1)
    {
        if (arg_is_info(argv[0]))
        {
            do_info = true;
        }
        else
        {
            fwupd_error("Wrong argument: %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    }

    /* Should be no more args */
    if (arg_next(&argc, &argv))
    {
        fwupd_verbose("Too many arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    ret = igsc_device_iterator_create(&iter);
    if (ret != IGSC_SUCCESS)
    {
        fwupd_error("Cannot create device iterator %d\n", ret);
        return EXIT_FAILURE;
    }

    info.name[0] = '\0';
    while ((ret = igsc_device_iterator_next(iter, &info)) == IGSC_SUCCESS)
    {

        ret = igsc_device_init_by_device_info(&handle, &info);
        if (ret != IGSC_SUCCESS)
        {
            /* make sure we have a printable name */
            info.name[0] = '\0';
            continue;
        }

        igsc_device_update_device_info(&handle, &info);

        ndevices++;

        printf("Device [%d] '%s': %04hx:%04hx %04hx:%04hx %04hu:%02x:%02x.%02x\n",
               ndevices,
               info.name,
               info.vendor_id, info.device_id,
               info.subsys_vendor_id, info.subsys_device_id,
               info.domain, info.bus, info.dev, info.func);

        if (do_info)
        {
            retries = 0;
            while ((ret = igsc_device_fw_version(&handle, &fw_version)) == IGSC_ERROR_BUSY)
            {
               gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
               if (++retries >= MAX_CONNECT_RETRIES)
                  break;
            }
            if (ret == IGSC_SUCCESS)
            {
                print_fw_version("", &fw_version);
            }
            retries = 0;
            while ((ret = igsc_device_oprom_version(&handle, IGSC_OPROM_CODE, &oprom_version)) == IGSC_ERROR_BUSY)
            {
               gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
               if (++retries >= MAX_CONNECT_RETRIES)
                  break;
            }
            if (ret == IGSC_SUCCESS)
            {
                print_oprom_code_version(&oprom_version);
            }
            retries = 0;
            while ((ret = igsc_device_oprom_version(&handle, IGSC_OPROM_DATA, &oprom_version))  == IGSC_ERROR_BUSY)
            {
               gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
               if (++retries >= MAX_CONNECT_RETRIES)
                  break;
            }
            if (ret == IGSC_SUCCESS)
            {
                print_oprom_data_version(&oprom_version);
            }
        }
        /* make sure we have a printable name */
        info.name[0] = '\0';
        (void)igsc_device_close(&handle);
    }
    if (ret == IGSC_ERROR_DEVICE_NOT_FOUND)
    {
        ret = EXIT_SUCCESS;
    }
    else
    {
        fwupd_error("Failure in the device iterator: %d\n", ret);
    }
    igsc_device_iterator_destroy(iter);

    if (ndevices == 0)
    {
        fwupd_msg("No device found\n");
    }

    return ret;
}